

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckCommand.h
# Opt level: O3

unique_ptr<cmCommand,_std::default_delete<cmCommand>_> __thiscall
cmCTestMemCheckCommand::Clone(cmCTestMemCheckCommand *this)

{
  _func_int *p_Var1;
  _func_int **__s;
  long in_RSI;
  
  __s = (_func_int **)operator_new(1000);
  memset(__s,0,1000);
  __s[0x17] = (_func_int *)(__s + 0x19);
  __s[0x1b] = (_func_int *)(__s + 0x1d);
  __s[0x1f] = (_func_int *)(__s + 0x21);
  __s[0x23] = (_func_int *)(__s + 0x25);
  __s[0x27] = (_func_int *)(__s + 0x29);
  __s[0x2b] = (_func_int *)(__s + 0x2d);
  __s[0x2f] = (_func_int *)(__s + 0x31);
  __s[0x33] = (_func_int *)(__s + 0x35);
  __s[0x37] = (_func_int *)(__s + 0x39);
  __s[0x3b] = (_func_int *)(__s + 0x3d);
  __s[0x3f] = (_func_int *)(__s + 0x41);
  __s[0x43] = (_func_int *)(__s + 0x45);
  __s[0x47] = (_func_int *)(__s + 0x49);
  __s[0x4b] = (_func_int *)(__s + 0x4d);
  __s[0x4f] = (_func_int *)(__s + 0x51);
  __s[0x53] = (_func_int *)(__s + 0x55);
  __s[0x57] = (_func_int *)(__s + 0x59);
  __s[0x60] = (_func_int *)(__s + 0x62);
  __s[100] = (_func_int *)(__s + 0x66);
  __s[0x68] = (_func_int *)(__s + 0x6a);
  __s[0x6c] = (_func_int *)(__s + 0x6e);
  __s[0x70] = (_func_int *)(__s + 0x72);
  __s[0x74] = (_func_int *)(__s + 0x76);
  *__s = (_func_int *)&PTR__cmCTestMemCheckCommand_00b1e130;
  __s[0x79] = (_func_int *)(__s + 0x7b);
  p_Var1 = *(_func_int **)(in_RSI + 0x20);
  __s[3] = *(_func_int **)(in_RSI + 0x18);
  __s[4] = p_Var1;
  (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.super_cmCTestCommand.super_cmCommand.
  _vptr_cmCommand = __s;
  return (__uniq_ptr_data<cmCommand,_std::default_delete<cmCommand>,_true,_true>)
         (__uniq_ptr_data<cmCommand,_std::default_delete<cmCommand>,_true,_true>)this;
}

Assistant:

std::unique_ptr<cmCommand> Clone() override
  {
    auto ni = cm::make_unique<cmCTestMemCheckCommand>();
    ni->CTest = this->CTest;
    ni->CTestScriptHandler = this->CTestScriptHandler;
    return std::unique_ptr<cmCommand>(std::move(ni));
  }